

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

void __thiscall
Catch::XmlReporter::listReporters
          (XmlReporter *this,
          vector<Catch::ReporterDescription,_std::allocator<Catch::ReporterDescription>_>
          *descriptions,IConfig *param_2)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pRVar2;
  XmlWriter *this_00;
  pointer text;
  ScopedElement outerTag;
  ScopedElement inner;
  string local_70;
  ScopedElement local_50;
  
  paVar1 = &local_70.field_2;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"AvailableReporters","");
  this_00 = &this->m_xml;
  XmlWriter::scopedElement((XmlWriter *)&local_50,(string *)this_00,(XmlFormatting)&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  text = (descriptions->
         super__Vector_base<Catch::ReporterDescription,_std::allocator<Catch::ReporterDescription>_>
         )._M_impl.super__Vector_impl_data._M_start;
  pRVar2 = (descriptions->
           super__Vector_base<Catch::ReporterDescription,_std::allocator<Catch::ReporterDescription>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (text != pRVar2) {
    do {
      local_70._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"Reporter","");
      XmlWriter::scopedElement
                ((XmlWriter *)&stack0xffffffffffffffc0,(string *)this_00,(XmlFormatting)&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != paVar1) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      local_70._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"Name","");
      XmlWriter::startElement(this_00,&local_70,Indent);
      XmlWriter::writeText(this_00,&text->name,None);
      XmlWriter::endElement(this_00,Newline);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != paVar1) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      local_70._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"Description","");
      XmlWriter::startElement(this_00,&local_70,Indent);
      XmlWriter::writeText(this_00,&text->description,None);
      XmlWriter::endElement(this_00,Newline);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != paVar1) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)&stack0xffffffffffffffc0);
      text = text + 1;
    } while (text != pRVar2);
  }
  XmlWriter::ScopedElement::~ScopedElement(&local_50);
  return;
}

Assistant:

void XmlReporter::listReporters(std::vector<ReporterDescription> const &descriptions, IConfig const &) {
        auto outerTag = m_xml.scopedElement("AvailableReporters");
        for (auto const &reporter : descriptions) {
            auto inner = m_xml.scopedElement("Reporter");
            m_xml.startElement("Name", XmlFormatting::Indent)
                .writeText(reporter.name, XmlFormatting::None)
                .endElement(XmlFormatting::Newline);
            m_xml.startElement("Description", XmlFormatting::Indent)
                .writeText(reporter.description, XmlFormatting::None)
                .endElement(XmlFormatting::Newline);
        }
    }